

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::LayerParameter::LayerParameter(LayerParameter *this,LayerParameter *from)

{
  void *pvVar1;
  uint uVar2;
  TransformationParameter *this_00;
  LossParameter *this_01;
  AccuracyParameter *this_02;
  ArgMaxParameter *this_03;
  ConcatParameter *this_04;
  ContrastiveLossParameter *this_05;
  ConvolutionParameter *this_06;
  DataParameter *this_07;
  DropoutParameter *this_08;
  DummyDataParameter *this_09;
  EltwiseParameter *this_10;
  ExpParameter *this_11;
  HDF5DataParameter *this_12;
  HDF5OutputParameter *this_13;
  HingeLossParameter *this_14;
  ImageDataParameter *this_15;
  InfogainLossParameter *this_16;
  InnerProductParameter *this_17;
  LRNParameter *this_18;
  MemoryDataParameter *this_19;
  MVNParameter *this_20;
  PoolingParameter *this_21;
  PowerParameter *this_22;
  ReLUParameter *this_23;
  SigmoidParameter *this_24;
  SoftmaxParameter *this_25;
  SliceParameter *this_26;
  TanHParameter *this_27;
  ThresholdParameter *this_28;
  WindowDataParameter *this_29;
  PythonParameter *this_30;
  PReLUParameter *this_31;
  SPPParameter *this_32;
  ReshapeParameter *this_33;
  LogParameter *this_34;
  FlattenParameter *this_35;
  ReductionParameter *this_36;
  EmbedParameter *this_37;
  TileParameter *this_38;
  BatchNormParameter *this_39;
  ELUParameter *this_40;
  BiasParameter *this_41;
  ScaleParameter *this_42;
  InputParameter *this_43;
  CropParameter *this_44;
  ParameterParameter *this_45;
  RecurrentParameter *this_46;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__LayerParameter_0075fc80;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  *(undefined8 *)(this->_has_bits_).has_bits_ = *(undefined8 *)(from->_has_bits_).has_bits_;
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField(&this->bottom_,&from->bottom_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField(&this->top_,&from->top_);
  google::protobuf::RepeatedField<float>::RepeatedField(&this->loss_weight_,&from->loss_weight_);
  google::protobuf::RepeatedPtrField<caffe::ParamSpec>::RepeatedPtrField
            (&this->param_,&from->param_);
  google::protobuf::RepeatedPtrField<caffe::BlobProto>::RepeatedPtrField
            (&this->blobs_,&from->blobs_);
  google::protobuf::RepeatedPtrField<caffe::NetStateRule>::RepeatedPtrField
            (&this->include_,&from->include_);
  google::protobuf::RepeatedPtrField<caffe::NetStateRule>::RepeatedPtrField
            (&this->exclude_,&from->exclude_);
  google::protobuf::RepeatedField<bool>::RepeatedField
            (&this->propagate_down_,&from->propagate_down_);
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->name_).ptr_ = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar2 = (from->_has_bits_).has_bits_[0];
  if ((uVar2 & 1) != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->name_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               (from->name_).ptr_);
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  (this->type_).ptr_ = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar2 & 2) != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->type_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               (from->type_).ptr_);
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar2 & 4) == 0) {
    this->transform_param_ = (TransformationParameter *)0x0;
  }
  else {
    this_00 = (TransformationParameter *)operator_new(0x40);
    TransformationParameter::TransformationParameter(this_00,from->transform_param_);
    this->transform_param_ = this_00;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar2 & 8) == 0) {
    this->loss_param_ = (LossParameter *)0x0;
  }
  else {
    this_01 = (LossParameter *)operator_new(0x28);
    LossParameter::LossParameter(this_01,from->loss_param_);
    this->loss_param_ = this_01;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar2 & 0x10) == 0) {
    this->accuracy_param_ = (AccuracyParameter *)0x0;
  }
  else {
    this_02 = (AccuracyParameter *)operator_new(0x28);
    AccuracyParameter::AccuracyParameter(this_02,from->accuracy_param_);
    this->accuracy_param_ = this_02;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar2 & 0x20) == 0) {
    this->argmax_param_ = (ArgMaxParameter *)0x0;
  }
  else {
    this_03 = (ArgMaxParameter *)operator_new(0x28);
    ArgMaxParameter::ArgMaxParameter(this_03,from->argmax_param_);
    this->argmax_param_ = this_03;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar2 & 0x40) == 0) {
    this->concat_param_ = (ConcatParameter *)0x0;
  }
  else {
    this_04 = (ConcatParameter *)operator_new(0x20);
    ConcatParameter::ConcatParameter(this_04,from->concat_param_);
    this->concat_param_ = this_04;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((char)uVar2 < '\0') {
    this_05 = (ContrastiveLossParameter *)operator_new(0x20);
    ContrastiveLossParameter::ContrastiveLossParameter(this_05,from->contrastive_loss_param_);
    this->contrastive_loss_param_ = this_05;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  else {
    this->contrastive_loss_param_ = (ContrastiveLossParameter *)0x0;
  }
  if ((uVar2 >> 8 & 1) == 0) {
    this->convolution_param_ = (ConvolutionParameter *)0x0;
  }
  else {
    this_06 = (ConvolutionParameter *)operator_new(0x98);
    ConvolutionParameter::ConvolutionParameter(this_06,from->convolution_param_);
    this->convolution_param_ = this_06;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar2 >> 9 & 1) == 0) {
    this->data_param_ = (DataParameter *)0x0;
  }
  else {
    this_07 = (DataParameter *)operator_new(0x48);
    DataParameter::DataParameter(this_07,from->data_param_);
    this->data_param_ = this_07;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar2 >> 10 & 1) == 0) {
    this->dropout_param_ = (DropoutParameter *)0x0;
  }
  else {
    this_08 = (DropoutParameter *)operator_new(0x20);
    DropoutParameter::DropoutParameter(this_08,from->dropout_param_);
    this->dropout_param_ = this_08;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar2 >> 0xb & 1) == 0) {
    this->dummy_data_param_ = (DummyDataParameter *)0x0;
  }
  else {
    this_09 = (DummyDataParameter *)operator_new(0x88);
    DummyDataParameter::DummyDataParameter(this_09,from->dummy_data_param_);
    this->dummy_data_param_ = this_09;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar2 >> 0xc & 1) == 0) {
    this->eltwise_param_ = (EltwiseParameter *)0x0;
  }
  else {
    this_10 = (EltwiseParameter *)operator_new(0x30);
    EltwiseParameter::EltwiseParameter(this_10,from->eltwise_param_);
    this->eltwise_param_ = this_10;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar2 >> 0xd & 1) == 0) {
    this->exp_param_ = (ExpParameter *)0x0;
  }
  else {
    this_11 = (ExpParameter *)operator_new(0x28);
    ExpParameter::ExpParameter(this_11,from->exp_param_);
    this->exp_param_ = this_11;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar2 >> 0xe & 1) == 0) {
    this->hdf5_data_param_ = (HDF5DataParameter *)0x0;
  }
  else {
    this_12 = (HDF5DataParameter *)operator_new(0x28);
    HDF5DataParameter::HDF5DataParameter(this_12,from->hdf5_data_param_);
    this->hdf5_data_param_ = this_12;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((short)uVar2 < 0) {
    this_13 = (HDF5OutputParameter *)operator_new(0x20);
    HDF5OutputParameter::HDF5OutputParameter(this_13,from->hdf5_output_param_);
    this->hdf5_output_param_ = this_13;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  else {
    this->hdf5_output_param_ = (HDF5OutputParameter *)0x0;
  }
  if ((uVar2 >> 0x10 & 1) == 0) {
    this->hinge_loss_param_ = (HingeLossParameter *)0x0;
  }
  else {
    this_14 = (HingeLossParameter *)operator_new(0x20);
    HingeLossParameter::HingeLossParameter(this_14,from->hinge_loss_param_);
    this->hinge_loss_param_ = this_14;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar2 >> 0x11 & 1) == 0) {
    this->image_data_param_ = (ImageDataParameter *)0x0;
  }
  else {
    this_15 = (ImageDataParameter *)operator_new(0x50);
    ImageDataParameter::ImageDataParameter(this_15,from->image_data_param_);
    this->image_data_param_ = this_15;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar2 >> 0x12 & 1) == 0) {
    this->infogain_loss_param_ = (InfogainLossParameter *)0x0;
  }
  else {
    this_16 = (InfogainLossParameter *)operator_new(0x20);
    InfogainLossParameter::InfogainLossParameter(this_16,from->infogain_loss_param_);
    this->infogain_loss_param_ = this_16;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar2 >> 0x13 & 1) == 0) {
    this->inner_product_param_ = (InnerProductParameter *)0x0;
  }
  else {
    this_17 = (InnerProductParameter *)operator_new(0x38);
    InnerProductParameter::InnerProductParameter(this_17,from->inner_product_param_);
    this->inner_product_param_ = this_17;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar2 >> 0x14 & 1) == 0) {
    this->lrn_param_ = (LRNParameter *)0x0;
  }
  else {
    this_18 = (LRNParameter *)operator_new(0x30);
    LRNParameter::LRNParameter(this_18,from->lrn_param_);
    this->lrn_param_ = this_18;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar2 >> 0x15 & 1) == 0) {
    this->memory_data_param_ = (MemoryDataParameter *)0x0;
  }
  else {
    this_19 = (MemoryDataParameter *)operator_new(0x28);
    MemoryDataParameter::MemoryDataParameter(this_19,from->memory_data_param_);
    this->memory_data_param_ = this_19;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar2 >> 0x16 & 1) == 0) {
    this->mvn_param_ = (MVNParameter *)0x0;
  }
  else {
    this_20 = (MVNParameter *)operator_new(0x20);
    MVNParameter::MVNParameter(this_20,from->mvn_param_);
    this->mvn_param_ = this_20;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar2 >> 0x17 & 1) == 0) {
    this->pooling_param_ = (PoolingParameter *)0x0;
  }
  else {
    this_21 = (PoolingParameter *)operator_new(0x48);
    PoolingParameter::PoolingParameter(this_21,from->pooling_param_);
    this->pooling_param_ = this_21;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar2 >> 0x18 & 1) == 0) {
    this->power_param_ = (PowerParameter *)0x0;
  }
  else {
    this_22 = (PowerParameter *)operator_new(0x28);
    PowerParameter::PowerParameter(this_22,from->power_param_);
    this->power_param_ = this_22;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar2 >> 0x19 & 1) == 0) {
    this->relu_param_ = (ReLUParameter *)0x0;
  }
  else {
    this_23 = (ReLUParameter *)operator_new(0x20);
    ReLUParameter::ReLUParameter(this_23,from->relu_param_);
    this->relu_param_ = this_23;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar2 >> 0x1a & 1) == 0) {
    this->sigmoid_param_ = (SigmoidParameter *)0x0;
  }
  else {
    this_24 = (SigmoidParameter *)operator_new(0x20);
    SigmoidParameter::SigmoidParameter(this_24,from->sigmoid_param_);
    this->sigmoid_param_ = this_24;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar2 >> 0x1b & 1) == 0) {
    this->softmax_param_ = (SoftmaxParameter *)0x0;
  }
  else {
    this_25 = (SoftmaxParameter *)operator_new(0x20);
    SoftmaxParameter::SoftmaxParameter(this_25,from->softmax_param_);
    this->softmax_param_ = this_25;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar2 >> 0x1c & 1) == 0) {
    this->slice_param_ = (SliceParameter *)0x0;
  }
  else {
    this_26 = (SliceParameter *)operator_new(0x30);
    SliceParameter::SliceParameter(this_26,from->slice_param_);
    this->slice_param_ = this_26;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar2 >> 0x1d & 1) == 0) {
    this->tanh_param_ = (TanHParameter *)0x0;
  }
  else {
    this_27 = (TanHParameter *)operator_new(0x20);
    TanHParameter::TanHParameter(this_27,from->tanh_param_);
    this->tanh_param_ = this_27;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar2 >> 0x1e & 1) == 0) {
    this->threshold_param_ = (ThresholdParameter *)0x0;
  }
  else {
    this_28 = (ThresholdParameter *)operator_new(0x20);
    ThresholdParameter::ThresholdParameter(this_28,from->threshold_param_);
    this->threshold_param_ = this_28;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((int)uVar2 < 0) {
    this_29 = (WindowDataParameter *)operator_new(0x58);
    WindowDataParameter::WindowDataParameter(this_29,from->window_data_param_);
  }
  else {
    this_29 = (WindowDataParameter *)0x0;
  }
  this->window_data_param_ = this_29;
  uVar2 = (from->_has_bits_).has_bits_[1];
  if ((uVar2 & 1) == 0) {
    this->python_param_ = (PythonParameter *)0x0;
  }
  else {
    this_30 = (PythonParameter *)operator_new(0x38);
    PythonParameter::PythonParameter(this_30,from->python_param_);
    this->python_param_ = this_30;
    uVar2 = (from->_has_bits_).has_bits_[1];
  }
  if ((uVar2 & 2) == 0) {
    this->prelu_param_ = (PReLUParameter *)0x0;
  }
  else {
    this_31 = (PReLUParameter *)operator_new(0x28);
    PReLUParameter::PReLUParameter(this_31,from->prelu_param_);
    this->prelu_param_ = this_31;
    uVar2 = (from->_has_bits_).has_bits_[1];
  }
  if ((uVar2 & 4) == 0) {
    this->spp_param_ = (SPPParameter *)0x0;
  }
  else {
    this_32 = (SPPParameter *)operator_new(0x28);
    SPPParameter::SPPParameter(this_32,from->spp_param_);
    this->spp_param_ = this_32;
    uVar2 = (from->_has_bits_).has_bits_[1];
  }
  if ((uVar2 & 8) == 0) {
    this->reshape_param_ = (ReshapeParameter *)0x0;
  }
  else {
    this_33 = (ReshapeParameter *)operator_new(0x28);
    ReshapeParameter::ReshapeParameter(this_33,from->reshape_param_);
    this->reshape_param_ = this_33;
    uVar2 = (from->_has_bits_).has_bits_[1];
  }
  if ((uVar2 & 0x10) == 0) {
    this->log_param_ = (LogParameter *)0x0;
  }
  else {
    this_34 = (LogParameter *)operator_new(0x28);
    LogParameter::LogParameter(this_34,from->log_param_);
    this->log_param_ = this_34;
    uVar2 = (from->_has_bits_).has_bits_[1];
  }
  if ((uVar2 & 0x20) == 0) {
    this->flatten_param_ = (FlattenParameter *)0x0;
  }
  else {
    this_35 = (FlattenParameter *)operator_new(0x20);
    FlattenParameter::FlattenParameter(this_35,from->flatten_param_);
    this->flatten_param_ = this_35;
    uVar2 = (from->_has_bits_).has_bits_[1];
  }
  if ((uVar2 & 0x40) == 0) {
    this->reduction_param_ = (ReductionParameter *)0x0;
  }
  else {
    this_36 = (ReductionParameter *)operator_new(0x28);
    ReductionParameter::ReductionParameter(this_36,from->reduction_param_);
    this->reduction_param_ = this_36;
    uVar2 = (from->_has_bits_).has_bits_[1];
  }
  if ((char)uVar2 < '\0') {
    this_37 = (EmbedParameter *)operator_new(0x38);
    EmbedParameter::EmbedParameter(this_37,from->embed_param_);
    this->embed_param_ = this_37;
    uVar2 = (from->_has_bits_).has_bits_[1];
  }
  else {
    this->embed_param_ = (EmbedParameter *)0x0;
  }
  if ((uVar2 >> 8 & 1) == 0) {
    this->tile_param_ = (TileParameter *)0x0;
  }
  else {
    this_38 = (TileParameter *)operator_new(0x20);
    TileParameter::TileParameter(this_38,from->tile_param_);
    this->tile_param_ = this_38;
    uVar2 = (from->_has_bits_).has_bits_[1];
  }
  if ((uVar2 >> 9 & 1) == 0) {
    this->batch_norm_param_ = (BatchNormParameter *)0x0;
  }
  else {
    this_39 = (BatchNormParameter *)operator_new(0x28);
    BatchNormParameter::BatchNormParameter(this_39,from->batch_norm_param_);
    this->batch_norm_param_ = this_39;
    uVar2 = (from->_has_bits_).has_bits_[1];
  }
  if ((uVar2 >> 10 & 1) == 0) {
    this->elu_param_ = (ELUParameter *)0x0;
  }
  else {
    this_40 = (ELUParameter *)operator_new(0x20);
    ELUParameter::ELUParameter(this_40,from->elu_param_);
    this->elu_param_ = this_40;
    uVar2 = (from->_has_bits_).has_bits_[1];
  }
  if ((uVar2 >> 0xb & 1) == 0) {
    this->bias_param_ = (BiasParameter *)0x0;
  }
  else {
    this_41 = (BiasParameter *)operator_new(0x28);
    BiasParameter::BiasParameter(this_41,from->bias_param_);
    this->bias_param_ = this_41;
    uVar2 = (from->_has_bits_).has_bits_[1];
  }
  if ((uVar2 >> 0xc & 1) == 0) {
    this->scale_param_ = (ScaleParameter *)0x0;
  }
  else {
    this_42 = (ScaleParameter *)operator_new(0x38);
    ScaleParameter::ScaleParameter(this_42,from->scale_param_);
    this->scale_param_ = this_42;
    uVar2 = (from->_has_bits_).has_bits_[1];
  }
  if ((uVar2 >> 0xd & 1) == 0) {
    this->input_param_ = (InputParameter *)0x0;
  }
  else {
    this_43 = (InputParameter *)operator_new(0x30);
    InputParameter::InputParameter(this_43,from->input_param_);
    this->input_param_ = this_43;
    uVar2 = (from->_has_bits_).has_bits_[1];
  }
  if ((uVar2 >> 0xe & 1) == 0) {
    this->crop_param_ = (CropParameter *)0x0;
  }
  else {
    this_44 = (CropParameter *)operator_new(0x30);
    CropParameter::CropParameter(this_44,from->crop_param_);
    this->crop_param_ = this_44;
    uVar2 = (from->_has_bits_).has_bits_[1];
  }
  if ((short)uVar2 < 0) {
    this_45 = (ParameterParameter *)operator_new(0x20);
    ParameterParameter::ParameterParameter(this_45,from->parameter_param_);
    this->parameter_param_ = this_45;
    uVar2 = (from->_has_bits_).has_bits_[1];
  }
  else {
    this->parameter_param_ = (ParameterParameter *)0x0;
  }
  if ((uVar2 >> 0x10 & 1) == 0) {
    this_46 = (RecurrentParameter *)0x0;
  }
  else {
    this_46 = (RecurrentParameter *)operator_new(0x30);
    RecurrentParameter::RecurrentParameter(this_46,from->recurrent_param_);
  }
  this->recurrent_param_ = this_46;
  this->phase_ = from->phase_;
  return;
}

Assistant:

LayerParameter::LayerParameter(const LayerParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      bottom_(from.bottom_),
      top_(from.top_),
      loss_weight_(from.loss_weight_),
      param_(from.param_),
      blobs_(from.blobs_),
      include_(from.include_),
      exclude_(from.exclude_),
      propagate_down_(from.propagate_down_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_name()) {
    name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
  }
  type_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_type()) {
    type_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.type_);
  }
  if (from.has_transform_param()) {
    transform_param_ = new ::caffe::TransformationParameter(*from.transform_param_);
  } else {
    transform_param_ = NULL;
  }
  if (from.has_loss_param()) {
    loss_param_ = new ::caffe::LossParameter(*from.loss_param_);
  } else {
    loss_param_ = NULL;
  }
  if (from.has_accuracy_param()) {
    accuracy_param_ = new ::caffe::AccuracyParameter(*from.accuracy_param_);
  } else {
    accuracy_param_ = NULL;
  }
  if (from.has_argmax_param()) {
    argmax_param_ = new ::caffe::ArgMaxParameter(*from.argmax_param_);
  } else {
    argmax_param_ = NULL;
  }
  if (from.has_concat_param()) {
    concat_param_ = new ::caffe::ConcatParameter(*from.concat_param_);
  } else {
    concat_param_ = NULL;
  }
  if (from.has_contrastive_loss_param()) {
    contrastive_loss_param_ = new ::caffe::ContrastiveLossParameter(*from.contrastive_loss_param_);
  } else {
    contrastive_loss_param_ = NULL;
  }
  if (from.has_convolution_param()) {
    convolution_param_ = new ::caffe::ConvolutionParameter(*from.convolution_param_);
  } else {
    convolution_param_ = NULL;
  }
  if (from.has_data_param()) {
    data_param_ = new ::caffe::DataParameter(*from.data_param_);
  } else {
    data_param_ = NULL;
  }
  if (from.has_dropout_param()) {
    dropout_param_ = new ::caffe::DropoutParameter(*from.dropout_param_);
  } else {
    dropout_param_ = NULL;
  }
  if (from.has_dummy_data_param()) {
    dummy_data_param_ = new ::caffe::DummyDataParameter(*from.dummy_data_param_);
  } else {
    dummy_data_param_ = NULL;
  }
  if (from.has_eltwise_param()) {
    eltwise_param_ = new ::caffe::EltwiseParameter(*from.eltwise_param_);
  } else {
    eltwise_param_ = NULL;
  }
  if (from.has_exp_param()) {
    exp_param_ = new ::caffe::ExpParameter(*from.exp_param_);
  } else {
    exp_param_ = NULL;
  }
  if (from.has_hdf5_data_param()) {
    hdf5_data_param_ = new ::caffe::HDF5DataParameter(*from.hdf5_data_param_);
  } else {
    hdf5_data_param_ = NULL;
  }
  if (from.has_hdf5_output_param()) {
    hdf5_output_param_ = new ::caffe::HDF5OutputParameter(*from.hdf5_output_param_);
  } else {
    hdf5_output_param_ = NULL;
  }
  if (from.has_hinge_loss_param()) {
    hinge_loss_param_ = new ::caffe::HingeLossParameter(*from.hinge_loss_param_);
  } else {
    hinge_loss_param_ = NULL;
  }
  if (from.has_image_data_param()) {
    image_data_param_ = new ::caffe::ImageDataParameter(*from.image_data_param_);
  } else {
    image_data_param_ = NULL;
  }
  if (from.has_infogain_loss_param()) {
    infogain_loss_param_ = new ::caffe::InfogainLossParameter(*from.infogain_loss_param_);
  } else {
    infogain_loss_param_ = NULL;
  }
  if (from.has_inner_product_param()) {
    inner_product_param_ = new ::caffe::InnerProductParameter(*from.inner_product_param_);
  } else {
    inner_product_param_ = NULL;
  }
  if (from.has_lrn_param()) {
    lrn_param_ = new ::caffe::LRNParameter(*from.lrn_param_);
  } else {
    lrn_param_ = NULL;
  }
  if (from.has_memory_data_param()) {
    memory_data_param_ = new ::caffe::MemoryDataParameter(*from.memory_data_param_);
  } else {
    memory_data_param_ = NULL;
  }
  if (from.has_mvn_param()) {
    mvn_param_ = new ::caffe::MVNParameter(*from.mvn_param_);
  } else {
    mvn_param_ = NULL;
  }
  if (from.has_pooling_param()) {
    pooling_param_ = new ::caffe::PoolingParameter(*from.pooling_param_);
  } else {
    pooling_param_ = NULL;
  }
  if (from.has_power_param()) {
    power_param_ = new ::caffe::PowerParameter(*from.power_param_);
  } else {
    power_param_ = NULL;
  }
  if (from.has_relu_param()) {
    relu_param_ = new ::caffe::ReLUParameter(*from.relu_param_);
  } else {
    relu_param_ = NULL;
  }
  if (from.has_sigmoid_param()) {
    sigmoid_param_ = new ::caffe::SigmoidParameter(*from.sigmoid_param_);
  } else {
    sigmoid_param_ = NULL;
  }
  if (from.has_softmax_param()) {
    softmax_param_ = new ::caffe::SoftmaxParameter(*from.softmax_param_);
  } else {
    softmax_param_ = NULL;
  }
  if (from.has_slice_param()) {
    slice_param_ = new ::caffe::SliceParameter(*from.slice_param_);
  } else {
    slice_param_ = NULL;
  }
  if (from.has_tanh_param()) {
    tanh_param_ = new ::caffe::TanHParameter(*from.tanh_param_);
  } else {
    tanh_param_ = NULL;
  }
  if (from.has_threshold_param()) {
    threshold_param_ = new ::caffe::ThresholdParameter(*from.threshold_param_);
  } else {
    threshold_param_ = NULL;
  }
  if (from.has_window_data_param()) {
    window_data_param_ = new ::caffe::WindowDataParameter(*from.window_data_param_);
  } else {
    window_data_param_ = NULL;
  }
  if (from.has_python_param()) {
    python_param_ = new ::caffe::PythonParameter(*from.python_param_);
  } else {
    python_param_ = NULL;
  }
  if (from.has_prelu_param()) {
    prelu_param_ = new ::caffe::PReLUParameter(*from.prelu_param_);
  } else {
    prelu_param_ = NULL;
  }
  if (from.has_spp_param()) {
    spp_param_ = new ::caffe::SPPParameter(*from.spp_param_);
  } else {
    spp_param_ = NULL;
  }
  if (from.has_reshape_param()) {
    reshape_param_ = new ::caffe::ReshapeParameter(*from.reshape_param_);
  } else {
    reshape_param_ = NULL;
  }
  if (from.has_log_param()) {
    log_param_ = new ::caffe::LogParameter(*from.log_param_);
  } else {
    log_param_ = NULL;
  }
  if (from.has_flatten_param()) {
    flatten_param_ = new ::caffe::FlattenParameter(*from.flatten_param_);
  } else {
    flatten_param_ = NULL;
  }
  if (from.has_reduction_param()) {
    reduction_param_ = new ::caffe::ReductionParameter(*from.reduction_param_);
  } else {
    reduction_param_ = NULL;
  }
  if (from.has_embed_param()) {
    embed_param_ = new ::caffe::EmbedParameter(*from.embed_param_);
  } else {
    embed_param_ = NULL;
  }
  if (from.has_tile_param()) {
    tile_param_ = new ::caffe::TileParameter(*from.tile_param_);
  } else {
    tile_param_ = NULL;
  }
  if (from.has_batch_norm_param()) {
    batch_norm_param_ = new ::caffe::BatchNormParameter(*from.batch_norm_param_);
  } else {
    batch_norm_param_ = NULL;
  }
  if (from.has_elu_param()) {
    elu_param_ = new ::caffe::ELUParameter(*from.elu_param_);
  } else {
    elu_param_ = NULL;
  }
  if (from.has_bias_param()) {
    bias_param_ = new ::caffe::BiasParameter(*from.bias_param_);
  } else {
    bias_param_ = NULL;
  }
  if (from.has_scale_param()) {
    scale_param_ = new ::caffe::ScaleParameter(*from.scale_param_);
  } else {
    scale_param_ = NULL;
  }
  if (from.has_input_param()) {
    input_param_ = new ::caffe::InputParameter(*from.input_param_);
  } else {
    input_param_ = NULL;
  }
  if (from.has_crop_param()) {
    crop_param_ = new ::caffe::CropParameter(*from.crop_param_);
  } else {
    crop_param_ = NULL;
  }
  if (from.has_parameter_param()) {
    parameter_param_ = new ::caffe::ParameterParameter(*from.parameter_param_);
  } else {
    parameter_param_ = NULL;
  }
  if (from.has_recurrent_param()) {
    recurrent_param_ = new ::caffe::RecurrentParameter(*from.recurrent_param_);
  } else {
    recurrent_param_ = NULL;
  }
  phase_ = from.phase_;
  // @@protoc_insertion_point(copy_constructor:caffe.LayerParameter)
}